

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O3

void __thiscall KDReports::Test::testEndlessPrinter(Test *this)

{
  char cVar1;
  int iVar2;
  Report report;
  TextElement elem;
  Report aRStack_88 [24];
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  TextElement local_38 [24];
  
  KDReports::Report::Report(aRStack_88,(QObject *)0x0);
  local_70.d._0_4_ = 0;
  local_70.d._4_2_ = 0;
  local_70.d._6_2_ = 0;
  local_70.ptr._0_6_ = 0x1065e4;
  local_70.ptr._6_2_ = 0;
  local_70.size = 3;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  KDReports::TextElement::TextElement(local_38,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  iVar2 = 400;
  do {
    local_70.d._0_4_ = 0;
    local_70.d._4_2_ = 0xffff;
    local_70.d._6_2_ = 0;
    local_70.ptr._0_6_ = 0;
    KDReports::Report::addElement(aRStack_88,local_38,1,&local_70);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  KDReports::Report::setWidthForEndlessPrinter(114.0);
  iVar2 = KDReports::Report::numberOfPages();
  cVar1 = QTest::qCompare(iVar2,1,"report.numberOfPages()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                          ,0x5a);
  if (cVar1 != '\0') {
    KDReports::Report::setWidthForEndlessPrinter(0.0);
    KDReports::Report::setPageSize((PageSizeId)aRStack_88);
    iVar2 = KDReports::Report::numberOfPages();
    QTest::qVerify(1 < iVar2,"report.numberOfPages() > 1","",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                   ,0x5e);
  }
  KDReports::TextElement::~TextElement(local_38);
  KDReports::Report::~Report(aRStack_88);
  return;
}

Assistant:

void testEndlessPrinter()
    {
        Report report;
        TextElement elem(QStringLiteral("foo"));
        for (int i = 0; i < 400; ++i) {
            report.addElement(elem);
        }
        report.setWidthForEndlessPrinter(114.0);
        QCOMPARE(report.numberOfPages(), 1);
        // Switching back to normal pagination
        report.setWidthForEndlessPrinter(0);
        report.setPageSize(QPageSize::A6);
        QVERIFY(report.numberOfPages() > 1);
    }